

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O1

xchar deepest_lev_reached(boolean noquest)

{
  int iVar1;
  char cVar2;
  long lVar3;
  long lVar4;
  char cVar5;
  dungeon *__s1;
  
  lVar3 = (long)n_dgns;
  if (lVar3 < 1) {
    cVar2 = '\0';
  }
  else {
    __s1 = dungeons;
    lVar4 = 0;
    cVar2 = '\0';
    do {
      cVar5 = __s1->dunlev_ureached;
      if ((cVar5 != '\0') &&
         (((iVar1 = strcmp(__s1->dname,"The Quest"), noquest == '\0' || (iVar1 != 0)) &&
          (cVar5 = cVar5 + (char)dungeons[lVar4 >> 0x38].depth_start + -1, cVar2 < cVar5)))) {
        cVar2 = cVar5;
      }
      __s1 = __s1 + 1;
      lVar4 = lVar4 + 0x100000000000000;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  return cVar2;
}

Assistant:

xchar deepest_lev_reached(boolean noquest)
{
	/* this function is used for three purposes: to provide a factor
	 * of difficulty in monster generation; to provide a factor of
	 * difficulty in experience calculations (botl.c and end.c); and
	 * to insert the deepest level reached in the game in the topten
	 * display.  the 'noquest' arg switch is required for the latter.
	 *
	 * from the player's point of view, going into the Quest is _not_
	 * going deeper into the dungeon -- it is going back "home", where
	 * the dungeon starts at level 1.  given the setup in dungeon.def,
	 * the depth of the Quest (thought of as starting at level 1) is
	 * never lower than the level of entry into the Quest, so we exclude
	 * the Quest from the topten "deepest level reached" display
	 * calculation.  _However_ the Quest is a difficult dungeon, so we
	 * include it in the factor of difficulty calculations.
	 */
	int i;
	d_level tmp;
	schar ret = 0;

	for (i = 0; i < n_dgns; i++) {
	    if ((tmp.dlevel = dungeons[i].dunlev_ureached) == 0) continue;
	    if (!strcmp(dungeons[i].dname, "The Quest") && noquest) continue;

	    tmp.dnum = i;
	    if (depth(&tmp) > ret) ret = depth(&tmp);
	}
	return (xchar) ret;
}